

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O3

cn_cbor * cn_cbor_decode(uchar *buf,size_t len,cn_cbor_errback *errp)

{
  anon_union_8_7_1acfe125_for_v *paVar1;
  byte bVar2;
  cn_cbor_type cVar3;
  ulong uVar4;
  cn_cbor *pcVar5;
  cn_cbor *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  cn_cbor *pcVar9;
  cn_cbor **ppcVar10;
  cn_cbor_error cVar11;
  byte *pbVar12;
  cn_cbor catcher;
  cn_cbor local_68;
  
  local_68.v.bytes = (uint8_t *)0x0;
  local_68.last_child = (cn_cbor *)0x0;
  local_68.next = (cn_cbor *)0x0;
  local_68.length = 0;
  local_68._20_4_ = 0;
  local_68.first_child = (cn_cbor *)0x0;
  local_68.parent = (cn_cbor *)0x0;
  local_68.type = CN_CBOR_INVALID;
  local_68.flags = 0;
  cVar11 = CN_CBOR_ERR_OUT_OF_DATA;
  pbVar12 = buf;
  if (len != 0) {
    pbVar8 = buf + len;
    pcVar6 = &local_68;
    pcVar5 = (cn_cbor *)0x0;
    do {
      bVar2 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      if (bVar2 == 0xff) {
        if ((pcVar6->flags & CN_CBOR_FL_INDEF) == 0) {
          cVar11 = CN_CBOR_ERR_BREAK_OUTSIDE_INDEF;
          goto LAB_00193bd9;
        }
        cVar3 = pcVar6->type;
        pcVar9 = pcVar5;
        if (cVar3 - CN_CBOR_BYTES < 2) {
          pcVar6->type = cVar3 + CN_CBOR_NULL;
        }
        else if ((cVar3 == CN_CBOR_MAP) && ((pcVar6->length & 1) != 0)) {
          cVar11 = CN_CBOR_ERR_ODD_SIZE_INDEF_MAP;
          goto LAB_00193bd9;
        }
        do {
          do {
            pcVar5 = pcVar6;
            if (pcVar5 == &local_68) {
              cVar11 = CN_CBOR_ERR_NOT_ALL_DATA_CONSUMED;
              if (pbVar12 == pbVar8) {
                if (pcVar9 != (cn_cbor *)0x0) {
                  pcVar9->parent = (cn_cbor *)0x0;
                  return pcVar9;
                }
                cVar11 = CN_CBOR_NO_ERROR;
                pbVar12 = pbVar8;
              }
              goto LAB_00193bd9;
            }
            pcVar6 = pcVar5->parent;
            if ((pcVar6->flags & CN_CBOR_FL_INDEF) != 0) {
              if (((pcVar6->type & ~CN_CBOR_TRUE) == CN_CBOR_BYTES) &&
                 (pcVar5->type != pcVar6->type)) {
                cVar11 = CN_CBOR_ERR_WRONG_NESTING_IN_INDEF_STRING;
                goto LAB_00193bd9;
              }
              goto LAB_00193b52;
            }
            pcVar9 = pcVar5;
          } while ((pcVar6->flags & CN_CBOR_FL_COUNT) == 0);
          paVar1 = &pcVar6->v;
          paVar1->bytes = (uint8_t *)(paVar1->sint + -1);
        } while (paVar1->bytes == (uint8_t *)0x0);
      }
      else {
        pcVar5 = (cn_cbor *)calloc(1,0x38);
        if (pcVar5 == (cn_cbor *)0x0) {
          cVar11 = CN_CBOR_ERR_OUT_OF_MEMORY;
          goto LAB_00193bd9;
        }
        uVar4 = (ulong)(bVar2 >> 5);
        pcVar5->type = mt_trans[uVar4];
        pcVar5->parent = pcVar6;
        ppcVar10 = &pcVar6->last_child->next;
        if (pcVar6->last_child == (cn_cbor *)0x0) {
          ppcVar10 = &pcVar6->first_child;
        }
        *ppcVar10 = pcVar5;
        pcVar6->last_child = pcVar5;
        pcVar6->length = pcVar6->length + 1;
        switch(bVar2 & 0x1f) {
        case 0x18:
          if (pbVar8 != pbVar12) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_00218380 + *(int *)(&DAT_00218380 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_00193b61;
        case 0x19:
          uVar7 = (long)pbVar8 - (long)pbVar12;
          pbVar8 = pbVar12;
          if (1 < uVar7) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_00218380 + *(int *)(&DAT_00218380 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_00193b61;
        case 0x1a:
          uVar7 = (long)pbVar8 - (long)pbVar12;
          pbVar8 = pbVar12;
          if (3 < uVar7) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_00218380 + *(int *)(&DAT_00218380 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_00193b61;
        case 0x1b:
          uVar7 = (long)pbVar8 - (long)pbVar12;
          pbVar8 = pbVar12;
          if (7 < uVar7) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_00218380 + *(int *)(&DAT_00218380 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_00193b61;
        case 0x1c:
        case 0x1d:
        case 0x1e:
          cVar11 = CN_CBOR_ERR_RESERVED_AI;
          goto LAB_00193bd9;
        case 0x1f:
          if (5 < (bVar2 >> 5) - 2) {
            cVar11 = CN_CBOR_ERR_MT_UNDEF_FOR_INDEF;
            goto LAB_00193bd9;
          }
          pcVar5->flags = CN_CBOR_FL_INDEF;
          pcVar6 = pcVar5;
          break;
        default:
          pcVar6 = (cn_cbor *)(*(code *)(&DAT_00218380 + *(int *)(&DAT_00218380 + uVar4 * 4)))();
          return pcVar6;
        }
      }
LAB_00193b52:
    } while (pbVar8 != pbVar12);
LAB_00193b61:
    cVar11 = CN_CBOR_ERR_OUT_OF_DATA;
    pbVar12 = pbVar8;
  }
LAB_00193bd9:
  if (local_68.first_child != (cn_cbor *)0x0) {
    (local_68.first_child)->parent = (cn_cbor *)0x0;
    cn_cbor_free(local_68.first_child);
  }
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = cVar11;
    errp->pos = (int)pbVar12 - (int)buf;
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_decode(const unsigned char* buf, size_t len CBOR_CONTEXT, cn_cbor_errback *errp) {
  cn_cbor catcher = {CN_CBOR_INVALID, 0, {0}, 0, NULL, NULL, NULL, NULL};
  struct parse_buf pb;
  cn_cbor* ret;

  pb.buf  = (unsigned char *)buf;
  pb.ebuf = (unsigned char *)buf+len;
  pb.err  = CN_CBOR_NO_ERROR;
  ret = decode_item(&pb CBOR_CONTEXT_PARAM, &catcher);
  if (ret != NULL) {
    /* mark as top node */
    ret->parent = NULL;
  } else {
    if (catcher.first_child) {
      catcher.first_child->parent = 0;
      cn_cbor_free(catcher.first_child CBOR_CONTEXT_PARAM);
    }
//fail:
    if (errp) {
      errp->err = pb.err;
      errp->pos = pb.buf - (unsigned char *)buf;
    }
    return NULL;
  }
  return ret;
}